

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O0

FieldEncodingEnum
bidfx_public_api::price::pixie::FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)

{
  code *pcVar1;
  undefined1 local_9;
  FieldTypeEnum field_local;
  
  if (field == DISCARD) {
    local_9 = NOOP;
  }
  else if (field == DOUBLE) {
    local_9 = FIXED8;
  }
  else if (field == INTEGER) {
    local_9 = FIXED4;
  }
  else if (field == LONG) {
    local_9 = FIXED8;
  }
  else {
    if (field != STRING) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_9 = VARINT_STRING;
  }
  return local_9;
}

Assistant:

FieldEncodingEnum FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)
{
    switch(field)
    {
        case UNRECOGNISED:
            return FieldEncodingEnum::NOOP;
        case DOUBLE:
            return FieldEncodingEnum::FIXED8;
        case INTEGER:
            return FieldEncodingEnum::FIXED4;
        case LONG:
            return FieldEncodingEnum::FIXED8;
        case STRING:
            return FieldEncodingEnum::VARINT_STRING;
    }
}